

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

char * helicsQueryExecute(HelicsQuery query,HelicsFederate fed,HelicsError *err)

{
  size_type sVar1;
  Federate *this;
  QueryObject *pQVar2;
  char *pcVar3;
  string_view target;
  string_view queryStr;
  string_view queryStr_00;
  string local_38;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    pcVar3 = 
    "{{\n  \"error\":{{\n    \"code\":404,\n    \"message\":\"federate object is not valid\"\n  }}\n}}"
    ;
  }
  else {
    pQVar2 = anon_unknown.dwarf_1862f::getQueryObj(query,err);
    if (pQVar2 == (QueryObject *)0x0) {
      pcVar3 = 
      "{{\n  \"error\":{{\n    \"code\":400,\n    \"message\":\"query object is not valid\"\n  }}\n}}"
      ;
    }
    else {
      sVar1 = (pQVar2->target)._M_string_length;
      if (sVar1 == 0) {
        queryStr._M_str = (pQVar2->query)._M_dataplus._M_p;
        queryStr._M_len = (pQVar2->query)._M_string_length;
        helics::Federate::query_abi_cxx11_(&local_38,this,queryStr,pQVar2->mode);
      }
      else {
        target._M_str = (pQVar2->target)._M_dataplus._M_p;
        target._M_len = sVar1;
        queryStr_00._M_str = (pQVar2->query)._M_dataplus._M_p;
        queryStr_00._M_len = (pQVar2->query)._M_string_length;
        helics::Federate::query_abi_cxx11_(&local_38,this,target,queryStr_00,pQVar2->mode);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&pQVar2->response,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      pcVar3 = (pQVar2->response)._M_dataplus._M_p;
    }
  }
  return pcVar3;
}

Assistant:

const char* helicsQueryExecute(HelicsQuery query, HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return invalidFedObConst;
    }

    auto* queryObj = getQueryObj(query, err);
    if (queryObj == nullptr) {
        return invalidQueryObConst;
    }
    try {
        if (queryObj->target.empty()) {
            queryObj->response = fedObj->query(queryObj->query, queryObj->mode);
        } else {
            queryObj->response = fedObj->query(queryObj->target, queryObj->query, queryObj->mode);
        }

        return queryObj->response.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    return queryErrorString;
    // LCOV_EXCL_START
}